

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

FlatFilePos __thiscall CBlockIndex::GetUndoPos(CBlockIndex *this)

{
  FlatFilePos FVar1;
  long in_FS_OFFSET;
  
  FVar1.nFile = -(uint)((this->nStatus & 0x10) == 0) | this->nFile;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    FVar1.nPos = (int)(this->nStatus << 0x1b) >> 0x1f & this->nUndoPos;
    return FVar1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
    {
        AssertLockHeld(::cs_main);
        FlatFilePos ret;
        if (nStatus & BLOCK_HAVE_UNDO) {
            ret.nFile = nFile;
            ret.nPos = nUndoPos;
        }
        return ret;
    }